

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.hpp
# Opt level: O2

matrix<int,_2UL> * __thiscall
trng::power<int,2ul>
          (matrix<int,_2UL> *__return_storage_ptr__,trng *this,matrix<int,_2UL> *a,
          unsigned_long_long m)

{
  matrix_type powers;
  _Vector_base<int,_std::allocator<int>_> local_50;
  _Vector_base<int,_std::allocator<int>_> local_38;
  
  matrix<int,2ul>::
  matrix<trng::power<int,2ul>(trng::matrix<int,2ul>const&,unsigned_long_long)::_lambda(unsigned_long,unsigned_long)_1_>
            ();
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_50,
             (vector<int,_std::allocator<int>_> *)this);
  for (; a != (matrix<int,_2UL> *)0x0; a = (matrix<int,_2UL> *)((ulong)a >> 1)) {
    if (((ulong)a & 1) != 0) {
      operator*((matrix<int,_2UL> *)&local_38,__return_storage_ptr__,(matrix<int,_2UL> *)&local_50);
      std::vector<int,_std::allocator<int>_>::_M_move_assign
                (&__return_storage_ptr__->data,&local_38);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
    }
    if (a == (matrix<int,_2UL> *)0x1) break;
    operator*((matrix<int,_2UL> *)&local_38,(matrix<int,_2UL> *)&local_50,
              (matrix<int,_2UL> *)&local_50);
    std::vector<int,_std::allocator<int>_>::_M_move_assign
              ((vector<int,_std::allocator<int>_> *)&local_50,&local_38);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_50);
  return __return_storage_ptr__;
}

Assistant:

matrix<T, n> power(const matrix<T, n> &a, unsigned long long m) {
    using matrix_type = matrix<T, n>;
    using size_type = typename matrix_type::size_type;

    auto unit = [&](size_type i, size_type j) -> T { return i == j ? T{1} : T{0}; };
    matrix_type res(unit);
    matrix_type powers(a);
    while (m > 0) {
      if ((m & 1ull) == 1ull)
        res = res * powers;
      m >>= 1u;
      if (m == 0)
        break;
      powers = powers * powers;
    }
    return res;
  }